

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::format<unsigned_long,long,StringLiteral>
               (ostream *out,char *fmt,unsigned_long *args,long *args_1,StringLiteral *args_2)

{
  FormatListN<3> local_88;
  StringLiteral *local_30;
  StringLiteral *args_local_2;
  long *args_local_1;
  unsigned_long *args_local;
  char *fmt_local;
  ostream *out_local;
  
  local_30 = args_2;
  args_local_2 = (StringLiteral *)args_1;
  args_local_1 = (long *)args;
  args_local = (unsigned_long *)fmt;
  fmt_local = (char *)out;
  makeFormatList<unsigned_long,long,StringLiteral>
            (&local_88,(tinyformat *)args,(unsigned_long *)args_1,(long *)args_2,args_2);
  vformat(out,fmt,&local_88.super_FormatList);
  return;
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}